

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::ComputeFileMD5(string *source,char *md5out)

{
  cmCryptoHashMD5 md5;
  string str;
  
  cmCryptoHashMD5::cmCryptoHashMD5(&md5);
  cmCryptoHash::HashFile(&str,&md5.super_cmCryptoHash,source);
  strncpy(md5out,str._M_dataplus._M_p,0x20);
  std::__cxx11::string::~string((string *)&str);
  cmCryptoHashMD5::~cmCryptoHashMD5(&md5);
  return str._M_string_length != 0;
}

Assistant:

bool cmSystemTools::ComputeFileMD5(const std::string& source, char* md5out)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  cmCryptoHashMD5 md5;
  std::string str = md5.HashFile(source);
  strncpy(md5out, str.c_str(), 32);
  return !str.empty();
#else
  (void)source;
  (void)md5out;
  cmSystemTools::Message("md5sum not supported in bootstrapping mode","Error");
  return false;
#endif
}